

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_add2_i32_m68k
               (TCGContext_conflict2 *tcg_ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 al,TCGv_i32 ah,
               TCGv_i32 bl,TCGv_i32 bh)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  uintptr_t o_2;
  
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_add2_i32);
  pTVar1->args[0] = (TCGArg)(rl + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(rh + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(al + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)(ah + (long)tcg_ctx);
  pTVar1->args[4] = (TCGArg)(bl + (long)tcg_ctx);
  pTVar1->args[5] = (TCGArg)(bh + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_add2_i32(TCGContext *tcg_ctx, TCGv_i32 rl, TCGv_i32 rh, TCGv_i32 al,
                      TCGv_i32 ah, TCGv_i32 bl, TCGv_i32 bh)
{
    if (TCG_TARGET_HAS_add2_i32) {
        tcg_gen_op6_i32(tcg_ctx, INDEX_op_add2_i32, rl, rh, al, ah, bl, bh);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_concat_i32_i64(tcg_ctx, t0, al, ah);
        tcg_gen_concat_i32_i64(tcg_ctx, t1, bl, bh);
        tcg_gen_add_i64(tcg_ctx, t0, t0, t1);
        tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    }
}